

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O3

float xm_next_of_sample(xm_channel_context_t *ch)

{
  float fVar1;
  uint8_t uVar2;
  xm_loop_type_t xVar3;
  uint uVar4;
  xm_sample_t *pxVar5;
  int8_t *piVar6;
  uint uVar7;
  ulong uVar8;
  int iVar9;
  uint32_t uVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  
  if (((ch->instrument == (xm_instrument_t *)0x0) ||
      (pxVar5 = ch->sample, pxVar5 == (xm_sample_t *)0x0)) ||
     (fVar1 = ch->sample_position, fVar1 < 0.0)) {
    uVar8 = ch->frame_count;
    fVar11 = 0.0;
    goto joined_r0x00104f26;
  }
  uVar7 = pxVar5->length;
  if (uVar7 == 0) {
    return 0.0;
  }
  iVar9 = (int)(long)fVar1;
  uVar8 = (long)fVar1 & 0xffffffff;
  fVar14 = (float)uVar8;
  uVar2 = pxVar5->bits;
  piVar6 = (pxVar5->field_11).data8;
  if (uVar2 == '\b') {
    fVar13 = (float)(int)piVar6[uVar8] * 0.0078125;
  }
  else {
    fVar13 = (float)(int)*(short *)(piVar6 + uVar8 * 2) * 3.0517578e-05;
  }
  uVar10 = iVar9 + 1;
  xVar3 = pxVar5->loop_type;
  fVar11 = fVar13;
  if (xVar3 == XM_PING_PONG_LOOP) {
    if (ch->ping == true) {
      fVar12 = fVar1 + ch->step;
      ch->sample_position = fVar12;
      uVar4 = pxVar5->loop_end;
      if (uVar10 < uVar4) {
        uVar8 = (ulong)uVar10;
      }
      if (uVar2 == '\b') {
        fVar13 = (float)(int)(pxVar5->field_11).data8[uVar8] * 0.0078125;
      }
      else {
        fVar13 = (float)(int)*(short *)((pxVar5->field_11).data8 + uVar8 * 2) * 3.0517578e-05;
      }
      if ((float)uVar4 <= fVar12) {
        ch->ping = false;
        fVar12 = (float)(uVar4 * 2) - fVar12;
        ch->sample_position = fVar12;
      }
      if ((float)uVar7 <= fVar12) {
        ch->ping = false;
        fVar12 = fVar12 - (float)(uVar7 - 1);
        goto LAB_001051bb;
      }
    }
    else {
      fVar15 = fVar1 - ch->step;
      ch->sample_position = fVar15;
      if (uVar8 == 0) {
        uVar8 = 0;
      }
      else {
        uVar7 = iVar9 - 1;
        if (pxVar5->loop_start < uVar7) {
          uVar8 = (ulong)uVar7;
        }
      }
      if (uVar2 == '\b') {
        fVar11 = (float)(int)(pxVar5->field_11).data8[uVar8] * 0.0078125;
      }
      else {
        fVar11 = (float)(int)*(short *)((pxVar5->field_11).data8 + uVar8 * 2) * 3.0517578e-05;
      }
      uVar7 = pxVar5->loop_start;
      if (fVar15 <= (float)uVar7) {
        ch->ping = true;
        fVar15 = (float)(uVar7 * 2) - fVar15;
        ch->sample_position = fVar15;
      }
      fVar12 = 0.0;
      if (fVar15 <= 0.0) {
        ch->ping = true;
LAB_001051bb:
        ch->sample_position = fVar12;
      }
    }
  }
  else {
    if (xVar3 == XM_FORWARD_LOOP) {
      if (uVar10 == pxVar5->loop_end) {
        uVar10 = pxVar5->loop_start;
      }
      if (uVar2 == '\b') {
        fVar13 = (float)(int)piVar6[uVar10] * 0.0078125;
      }
      else {
        fVar13 = (float)(int)*(short *)(piVar6 + (ulong)uVar10 * 2) * 3.0517578e-05;
      }
      fVar15 = (float)pxVar5->loop_end;
      fVar12 = fVar1 + ch->step;
      if (fVar15 <= fVar12) {
        do {
          fVar12 = fVar12 - (float)pxVar5->loop_length;
        } while (fVar15 <= fVar12);
      }
      goto LAB_001051bb;
    }
    fVar13 = 0.0;
    if (xVar3 == XM_NO_LOOP) {
      if (uVar10 < uVar7) {
        if (uVar2 == '\b') {
          fVar13 = (float)(int)piVar6[uVar10] * 0.0078125;
        }
        else {
          fVar13 = (float)(int)*(short *)(piVar6 + (ulong)uVar10 * 2) * 3.0517578e-05;
        }
      }
      fVar12 = fVar1 + ch->step;
      ch->sample_position = fVar12;
      if ((float)uVar7 <= fVar12) {
        fVar12 = -1.0;
        goto LAB_001051bb;
      }
    }
  }
  fVar11 = (fVar1 - fVar14) * (fVar13 - fVar11) + fVar11;
  uVar8 = ch->frame_count;
joined_r0x00104f26:
  if (uVar8 < 0x20) {
    fVar11 = (fVar11 - ch->end_of_previous_sample[uVar8]) * (float)(long)uVar8 * 0.03125 +
             ch->end_of_previous_sample[uVar8];
  }
  return fVar11;
}

Assistant:

static float xm_next_of_sample(xm_channel_context_t* ch) {
	if(ch->instrument == NULL || ch->sample == NULL || ch->sample_position < 0) {
#if XM_RAMPING
		if(ch->frame_count < XM_SAMPLE_RAMPING_POINTS) {
			return XM_LERP(ch->end_of_previous_sample[ch->frame_count], .0f,
			               (float)ch->frame_count / (float)XM_SAMPLE_RAMPING_POINTS);
		}
#endif
		return .0f;
	}
	if(ch->sample->length == 0) {
		return .0f;
	}

	float u, v, t;
	uint32_t a, b;
	a = (uint32_t)ch->sample_position; /* This cast is fine,
										* sample_position will not
										* go above integer
										* ranges */
	if(XM_LINEAR_INTERPOLATION) {
		b = a + 1;
		t = ch->sample_position - a; /* Cheaper than fmodf(., 1.f) */
	}
	u = xm_sample_at(ch->sample, a);

	switch(ch->sample->loop_type) {

	case XM_NO_LOOP:
		if(XM_LINEAR_INTERPOLATION) {
			v = (b < ch->sample->length) ? xm_sample_at(ch->sample, b) : .0f;
		}
		ch->sample_position += ch->step;
		if(ch->sample_position >= ch->sample->length) {
			ch->sample_position = -1;
		}
		break;

	case XM_FORWARD_LOOP:
		if(XM_LINEAR_INTERPOLATION) {
			v = xm_sample_at(
				ch->sample,
				(b == ch->sample->loop_end) ? ch->sample->loop_start : b
				);
		}
		ch->sample_position += ch->step;
		while(ch->sample_position >= ch->sample->loop_end) {
			ch->sample_position -= ch->sample->loop_length;
		}
		break;

	case XM_PING_PONG_LOOP:
		if(ch->ping) {
			ch->sample_position += ch->step;
		} else {
			ch->sample_position -= ch->step;
		}
		/* XXX: this may not work for very tight ping-pong loops
		 * (ie switches direction more than once per sample */
		if(ch->ping) {
			if(XM_LINEAR_INTERPOLATION) {
				v = xm_sample_at(ch->sample, (b >= ch->sample->loop_end) ? a : b);
			}
			if(ch->sample_position >= ch->sample->loop_end) {
				ch->ping = false;
				ch->sample_position = (ch->sample->loop_end << 1) - ch->sample_position;
			}
			/* sanity checking */
			if(ch->sample_position >= ch->sample->length) {
				ch->ping = false;
				ch->sample_position -= ch->sample->length - 1;
			}
		} else {
			if(XM_LINEAR_INTERPOLATION) {
				v = u;
				u = xm_sample_at(
					ch->sample,
					(b == 1 || b - 2 <= ch->sample->loop_start) ? a : (b - 2)
					);
			}
			if(ch->sample_position <= ch->sample->loop_start) {
				ch->ping = true;
				ch->sample_position = (ch->sample->loop_start << 1) - ch->sample_position;
			}
			/* sanity checking */
			if(ch->sample_position <= .0f) {
				ch->ping = true;
				ch->sample_position = .0f;
			}
		}
		break;

	default:
		v = .0f;
		break;
	}

	float endval = (XM_LINEAR_INTERPOLATION ? XM_LERP(u, v, t) : u);

#if XM_RAMPING
	if(ch->frame_count < XM_SAMPLE_RAMPING_POINTS) {
		/* Smoothly transition between old and new sample. */
		return XM_LERP(ch->end_of_previous_sample[ch->frame_count], endval,
		               (float)ch->frame_count / (float)XM_SAMPLE_RAMPING_POINTS);
	}
#endif

	return endval;
}